

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::CommitShaderResources
          (DeviceContextVkImpl *this,IShaderResourceBinding *pShaderResourceBinding,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  ShaderResourceCacheVk *this_00;
  Uint64 *pUVar1;
  byte bVar2;
  PipelineResourceSignatureVkImpl *this_01;
  pointer pcVar3;
  VkDescriptorSetLayout SetLayout;
  Uint32 UVar4;
  DescriptorSet *pDVar5;
  VkDescriptorSet pVVar6;
  char (*Args_1) [30];
  Uint64 *Args_1_00;
  uint Index;
  ulong uVar7;
  Uint64 *pUVar8;
  string msg;
  string local_68;
  undefined8 local_48;
  Uint64 *local_38;
  
  Args_1 = (char (*) [30])0x0;
  DeviceContextBase<Diligent::EngineVkImplTraits>::CommitShaderResources
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pShaderResourceBinding,
             StateTransitionMode,0);
  if (pShaderResourceBinding != (IShaderResourceBinding *)0x0) {
    CheckDynamicType<Diligent::ShaderResourceBindingVkImpl,Diligent::IShaderResourceBinding>
              (pShaderResourceBinding);
  }
  if (*(short *)&pShaderResourceBinding[7].super_IObject._vptr_IObject != 0) {
    this_00 = (ShaderResourceCacheVk *)(pShaderResourceBinding + 4);
    ShaderResourceCacheVk::DbgVerifyDynamicBuffersCounter(this_00);
    if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY) {
      ShaderResourceCacheVk::TransitionResources<true>(this_00,this);
    }
    else if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) {
      ShaderResourceCacheVk::TransitionResources<false>(this_00,this);
    }
    this_01 = (PipelineResourceSignatureVkImpl *)
              pShaderResourceBinding[2].super_IObject._vptr_IObject;
    bVar2 = (this_01->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
            .m_Desc.BindingIndex;
    uVar7 = (ulong)(this_01->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                   m_PipelineType;
    if (uVar7 == 0xff) {
      FormatString<char[26],char[30]>
                (&local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Type != PIPELINE_TYPE_INVALID",Args_1);
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"GetBindInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x18d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    local_68._M_dataplus._M_p = (pointer)0x0;
    local_68.field_2._M_allocated_capacity = 0;
    local_48 = 0;
    local_68._M_string_length = 1;
    local_68.field_2._8_8_ = 2;
    pcVar3 = (&local_68._M_dataplus)[uVar7]._M_p;
    pUVar1 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_VertexStreams
              [(long)pcVar3 * 0x1f + -2].Offset;
    pUVar8 = pUVar1 + (ulong)bVar2 * 4 + 0x11d;
    Args_1_00 = pUVar1;
    DeviceContextBase<Diligent::EngineVkImplTraits>::CommittedShaderResources::Set
              (&(this->m_BindInfo)._M_elems[(long)pcVar3].super_CommittedShaderResources,(uint)bVar2
               ,(ShaderResourceBindingImplType *)pShaderResourceBinding);
    *pUVar8 = 0;
    pUVar1[(ulong)bVar2 * 4 + 0x11e] = 0;
    local_38 = pUVar8;
    if ((this_01->m_VkDescrSetLayouts)._M_elems[0].m_VkObject == (VkDescriptorSetLayout_T *)0x0) {
      Index = 0;
    }
    else {
      UVar4 = PipelineResourceSignatureVkImpl::
              GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)0>
                        (this_01);
      if (UVar4 != 0) {
        FormatString<char[26],char[114]>
                  (&local_68,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE>()"
                   ,(char (*) [114])Args_1_00);
        Args_1_00 = (Uint64 *)0x23d;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x23d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      pDVar5 = ShaderResourceCacheVk::GetDescriptorSet(this_00,0);
      pVVar6 = (pDVar5->m_DescriptorSetAllocation).Set;
      if (pVVar6 == (VkDescriptorSet)0x0) {
        FormatString<char[26],char[54]>
                  (&local_68,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"CachedDescrSet.GetVkDescriptorSet() != VK_NULL_HANDLE",
                   (char (*) [54])Args_1_00);
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x23f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pVVar6 = (pDVar5->m_DescriptorSetAllocation).Set;
      }
      *local_38 = (Uint64)pVVar6;
      Index = 1;
      Args_1_00 = local_38;
    }
    if ((this_01->m_VkDescrSetLayouts)._M_elems[1].m_VkObject != (VkDescriptorSetLayout_T *)0x0) {
      UVar4 = PipelineResourceSignatureVkImpl::
              GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)1>
                        (this_01);
      if (Index != UVar4) {
        FormatString<char[26],char[107]>
                  (&local_68,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC>()"
                   ,(char (*) [107])Args_1_00);
        Args_1_00 = (Uint64 *)0x246;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x246);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      pDVar5 = ShaderResourceCacheVk::GetDescriptorSet(this_00,Index);
      if ((pDVar5->m_DescriptorSetAllocation).Set != (VkDescriptorSet)0x0) {
        FormatString<char[26],char[121]>
                  (&local_68,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "const_cast<const ShaderResourceCacheVk&>(ResourceCache).GetDescriptorSet(DSIndex).GetVkDescriptorSet() == VK_NULL_HANDLE"
                   ,(char (*) [121])Args_1_00);
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"CommitShaderResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x247);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      SetLayout = (this_01->m_VkDescrSetLayouts)._M_elems[1].m_VkObject;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Dynamic Descriptor Set","");
      std::__cxx11::string::append((char *)&local_68);
      std::__cxx11::string::append((char *)&local_68);
      std::__cxx11::string::push_back((char)&local_68);
      pVVar6 = DynamicDescriptorSetAllocator::Allocate
                         (&this->m_DynamicDescrSetAllocator,SetLayout,local_68._M_dataplus._M_p);
      PipelineResourceSignatureVkImpl::CommitDynamicResources(this_01,this_00,pVVar6);
      local_38[Index] = (Uint64)pVVar6;
      Args_1_00 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      Index = Index + 1;
    }
    if (Index != *(ushort *)&pShaderResourceBinding[7].super_IObject._vptr_IObject) {
      FormatString<char[26],char[48]>
                (&local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DSIndex == ResourceCache.GetNumDescriptorSets()",
                 (char (*) [48])Args_1_00);
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"CommitShaderResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x25e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CommitShaderResources(IShaderResourceBinding* pShaderResourceBinding, RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    TDeviceContextBase::CommitShaderResources(pShaderResourceBinding, StateTransitionMode, 0 /*Dummy*/);

    ShaderResourceBindingVkImpl* pResBindingVkImpl = ClassPtrCast<ShaderResourceBindingVkImpl>(pShaderResourceBinding);
    ShaderResourceCacheVk&       ResourceCache     = pResBindingVkImpl->GetResourceCache();
    if (ResourceCache.GetNumDescriptorSets() == 0)
    {
        // Ignore SRBs that contain no resources
        return;
    }

#ifdef DILIGENT_DEBUG
    ResourceCache.DbgVerifyDynamicBuffersCounter();
#endif

    if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
    {
        ResourceCache.TransitionResources<false>(this);
    }
#ifdef DILIGENT_DEVELOPMENT
    else if (StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
    {
        ResourceCache.TransitionResources<true>(this);
    }
#endif

    const Uint32                           SRBIndex   = pResBindingVkImpl->GetBindingIndex();
    const PipelineResourceSignatureVkImpl* pSignature = pResBindingVkImpl->GetSignature();
    ResourceBindInfo&                      BindInfo   = GetBindInfo(pResBindingVkImpl->GetPipelineType());
    ResourceBindInfo::DescriptorSetInfo&   SetInfo    = BindInfo.SetInfo[SRBIndex];

    BindInfo.Set(SRBIndex, pResBindingVkImpl);
    // We must not clear entire ResInfo as DescriptorSetBaseInd and DynamicOffsetCount
    // are set by SetPipelineState().
    SetInfo.vkSets = {};

    Uint32 DSIndex = 0;
    if (pSignature->HasDescriptorSet(PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE))
    {
        VERIFY_EXPR(DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_STATIC_MUTABLE>());
        const ShaderResourceCacheVk::DescriptorSet& CachedDescrSet = const_cast<const ShaderResourceCacheVk&>(ResourceCache).GetDescriptorSet(DSIndex);
        VERIFY_EXPR(CachedDescrSet.GetVkDescriptorSet() != VK_NULL_HANDLE);
        SetInfo.vkSets[DSIndex] = CachedDescrSet.GetVkDescriptorSet();
        ++DSIndex;
    }

    if (pSignature->HasDescriptorSet(PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC))
    {
        VERIFY_EXPR(DSIndex == pSignature->GetDescriptorSetIndex<PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC>());
        VERIFY_EXPR(const_cast<const ShaderResourceCacheVk&>(ResourceCache).GetDescriptorSet(DSIndex).GetVkDescriptorSet() == VK_NULL_HANDLE);

        const VkDescriptorSetLayout vkLayout = pSignature->GetVkDescriptorSetLayout(PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID_DYNAMIC);

        VkDescriptorSet vkDynamicDescrSet   = VK_NULL_HANDLE;
        const char*     DynamicDescrSetName = "Dynamic Descriptor Set";
#ifdef DILIGENT_DEVELOPMENT
        String _DynamicDescrSetName{DynamicDescrSetName};
        _DynamicDescrSetName.append(" (");
        _DynamicDescrSetName.append(pSignature->GetDesc().Name);
        _DynamicDescrSetName += ')';
        DynamicDescrSetName = _DynamicDescrSetName.c_str();
#endif
        // Allocate vulkan descriptor set for dynamic resources
        vkDynamicDescrSet = AllocateDynamicDescriptorSet(vkLayout, DynamicDescrSetName);

        // Write all dynamic resource descriptors
        pSignature->CommitDynamicResources(ResourceCache, vkDynamicDescrSet);

        SetInfo.vkSets[DSIndex] = vkDynamicDescrSet;
        ++DSIndex;
    }

    VERIFY_EXPR(DSIndex == ResourceCache.GetNumDescriptorSets());
}